

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate)

{
  REF_NODE pRVar1;
  REF_ADJ pRVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  REF_ADJ_ITEM pRVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  pRVar1 = ref_migrate->grid->node;
  lVar3 = -1;
  lVar8 = 0;
  while( true ) {
    if (ref_migrate->max <= lVar8) {
      return 0;
    }
    if (ref_migrate->global[lVar8] != -1) break;
LAB_001fe1ca:
    lVar8 = lVar8 + 1;
  }
  lVar7 = lVar3;
  if ((lVar8 < pRVar1->max) && (lVar7 = pRVar1->global[lVar8], pRVar1->global[lVar8] < 0)) {
    lVar7 = lVar3;
  }
  printf(" %2d : %ld :",(ulong)(uint)pRVar1->ref_mpi->id,lVar7);
  pRVar2 = ref_migrate->parent_local;
  iVar9 = -1;
  iVar4 = iVar9;
  if (pRVar2->nnode <= lVar8) goto LAB_001fe177;
  iVar5 = pRVar2->first[lVar8];
  if (iVar5 == -1) goto LAB_001fe177;
  pRVar6 = pRVar2->item;
  do {
    iVar9 = pRVar6[iVar5].ref;
    iVar4 = iVar5;
LAB_001fe177:
    iVar5 = iVar4;
    lVar7 = (long)iVar9;
    do {
      if (iVar5 == -1) {
        putchar(10);
        goto LAB_001fe1ca;
      }
      printf(" %ld+%d",ref_migrate->global[lVar7],
             (ulong)(uint)ref_migrate->parent_part->item[iVar5].ref);
      pRVar6 = ref_migrate->parent_local->item;
      iVar5 = pRVar6[iVar5].next;
      lVar7 = lVar3;
    } while (iVar5 == -1);
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT node, item, local, part;
  REF_GLOB global;

  each_ref_migrate_node(ref_migrate, node) {
    printf(" %2d : " REF_GLOB_FMT " :", ref_mpi_rank(ref_node_mpi(ref_node)),
           ref_node_global(ref_node, node));
    each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), node,
                                    item, local) {
      global = ref_migrate_global(ref_migrate, local);
      part = ref_adj_item_ref(ref_migrate_parent_part(ref_migrate), item);
      printf(" " REF_GLOB_FMT "+%d", global, part);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}